

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

aiMaterial * __thiscall Assimp::D3MF::XmlSerializer::readMaterialDef(XmlSerializer *this)

{
  XmlReader *pXVar1;
  __type _Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  undefined4 extraout_var_00;
  allocator<char> local_4c1;
  string local_4c0 [32];
  undefined1 local_4a0 [8];
  string strId;
  aiString matName;
  string stdMatName;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string nodeName;
  char *name;
  aiMaterial *mat;
  XmlSerializer *this_local;
  
  name = (char *)0x0;
  nodeName.field_2._8_8_ = 0;
  iVar3 = (*this->xmlReader->_vptr_IIrrXMLReader[0xd])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_40,(char *)CONCAT44(extraout_var,iVar3),&local_41);
  std::allocator<char>::~allocator(&local_41);
  _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)XmlTag::basematerials_base_abi_cxx11_);
  if (_Var2) {
    pXVar1 = this->xmlReader;
    uVar4 = std::__cxx11::string::c_str();
    iVar3 = (*pXVar1->_vptr_IIrrXMLReader[7])(pXVar1,uVar4);
    nodeName.field_2._8_8_ = CONCAT44(extraout_var_00,iVar3);
    std::__cxx11::string::string((string *)(matName.data + 0x3f8));
    aiString::aiString((aiString *)((long)&strId.field_2 + 0xc));
    to_string<unsigned_int>((string *)local_4a0,this->mActiveMatGroup);
    std::__cxx11::string::operator+=((string *)(matName.data + 0x3f8),"id");
    std::__cxx11::string::operator+=((string *)(matName.data + 0x3f8),(string *)local_4a0);
    std::__cxx11::string::operator+=((string *)(matName.data + 0x3f8),"_");
    uVar4 = nodeName.field_2._8_8_;
    if (nodeName.field_2._8_8_ == 0) {
      std::__cxx11::string::operator+=((string *)(matName.data + 0x3f8),"basemat");
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_4c0,(char *)uVar4,&local_4c1);
      std::__cxx11::string::operator+=((string *)(matName.data + 0x3f8),local_4c0);
      std::__cxx11::string::~string(local_4c0);
      std::allocator<char>::~allocator(&local_4c1);
    }
    aiString::Set((aiString *)((long)&strId.field_2 + 0xc),(string *)(matName.data + 0x3f8));
    name = (char *)operator_new(0x10);
    aiMaterial::aiMaterial((aiMaterial *)name);
    aiMaterial::AddProperty
              ((aiMaterial *)name,(aiString *)((long)&strId.field_2 + 0xc),"?mat.name",0,0);
    assignDiffuseColor(this,(aiMaterial *)name);
    std::__cxx11::string::~string((string *)local_4a0);
    std::__cxx11::string::~string((string *)(matName.data + 0x3f8));
  }
  std::__cxx11::string::~string((string *)local_40);
  return (aiMaterial *)name;
}

Assistant:

aiMaterial *readMaterialDef() {
        aiMaterial *mat( nullptr );
        const char *name( nullptr );
        const std::string nodeName( xmlReader->getNodeName() );
        if ( nodeName == D3MF::XmlTag::basematerials_base ) {
            name = xmlReader->getAttributeValue( D3MF::XmlTag::basematerials_name.c_str() );
            std::string stdMatName;
            aiString matName;
            std::string strId( to_string( mActiveMatGroup ) );
            stdMatName += "id";
            stdMatName += strId;
            stdMatName += "_";
            if ( nullptr != name ) {
                stdMatName += std::string( name );
            } else {
                stdMatName += "basemat";
            }
            matName.Set( stdMatName );

            mat = new aiMaterial;
            mat->AddProperty( &matName, AI_MATKEY_NAME );

            assignDiffuseColor( mat );
        }

        return mat;
    }